

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_divw(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 arg3;
  TCGv_i32 arg2;
  ea_what what;
  bool bVar1;
  TCGv_i32 destr;
  TCGv_i32 src;
  int sign;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  bVar1 = (insn & 0x100) != 0;
  what = EA_LOADU;
  if (bVar1) {
    what = EA_LOADS;
  }
  arg3 = gen_ea(env,s,insn,1,tcg_ctx_00->NULL_QREG,(TCGv_i32 *)0x0,what,
                (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (arg3 == tcg_ctx_00->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    arg2 = tcg_const_i32_m68k(tcg_ctx_00,(int)(uint)insn >> 9 & 7);
    if (bVar1) {
      gen_helper_divsw(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,arg3);
    }
    else {
      gen_helper_divuw(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,arg3);
    }
    tcg_temp_free_i32(tcg_ctx_00,arg2);
    set_cc_op(s,CC_OP_FLAGS);
  }
  return;
}

Assistant:

DISAS_INSN(divw)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int sign;
    TCGv src;
    TCGv destr;

    /* divX.w <EA>,Dn    32/16 -> 16r:16q */

    sign = (insn & 0x100) != 0;

    /* dest.l / src.w */

    SRC_EA(env, src, OS_WORD, sign, NULL);
    destr = tcg_const_i32(tcg_ctx, REG(insn, 9));
    if (sign) {
        gen_helper_divsw(tcg_ctx, tcg_ctx->cpu_env, destr, src);
    } else {
        gen_helper_divuw(tcg_ctx, tcg_ctx->cpu_env, destr, src);
    }
    tcg_temp_free(tcg_ctx, destr);

    set_cc_op(s, CC_OP_FLAGS);
}